

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void * xmlGzfileOpen_real(char *filename)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  stat stat_buffer;
  stat64 sStack_98;
  
  if ((*filename == '-') && (filename[1] == '\0')) {
    iVar1 = fileno(_stdin);
    iVar1 = dup(iVar1);
    pvVar3 = (void *)gzdopen(iVar1,"rb");
    if (iVar1 < 0 || pvVar3 != (void *)0x0) {
      return pvVar3;
    }
    close(iVar1);
  }
  else {
    iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file://localhost/",0x11);
    if (iVar1 == 0) {
      lVar2 = 0x10;
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:///",8);
      lVar2 = 7;
      if (iVar1 != 0) {
        lVar2 = 0;
      }
    }
    iVar1 = stat64(filename + lVar2,&sStack_98);
    if (iVar1 != -1) {
      pvVar3 = (void *)gzopen64(filename + lVar2,"rb");
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
xmlGzfileOpen_real (const char *filename) {
    const char *path = NULL;
    gzFile fd;

    if (!strcmp(filename, "-")) {
        int duped_fd = dup(fileno(stdin));
        fd = gzdopen(duped_fd, "rb");
        if (fd == Z_NULL && duped_fd >= 0) {
            close(duped_fd);  /* gzdOpen() does not close on failure */
        }

	return((void *) fd);
    }

    if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file://localhost/", 17))
#if defined (_WIN32)
	path = &filename[17];
#else
	path = &filename[16];
#endif
    else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:///", 8)) {
#if defined (_WIN32)
	path = &filename[8];
#else
	path = &filename[7];
#endif
    } else
	path = filename;

    if (path == NULL)
	return(NULL);
    if (!xmlCheckFilename(path))
        return(NULL);

#if defined(_WIN32)
    fd = xmlWrapGzOpenUtf8(path, "rb");
#else
    fd = gzopen(path, "rb");
#endif
    return((void *) fd);
}